

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O0

void __thiscall
o3dgc::TriangleFans::TriangleFans(TriangleFans *this,long sizeTFAN,long verticesSize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  long *plVar4;
  long verticesSize_local;
  long sizeTFAN_local;
  TriangleFans *this_local;
  
  if (sizeTFAN < 1) {
    __assert_fail("sizeTFAN > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                  ,0xae,"o3dgc::TriangleFans::TriangleFans(long, long)");
  }
  if (0 < verticesSize) {
    this->m_numTFANs = 0;
    this->m_numVertices = 0;
    this->m_verticesAllocatedSize = verticesSize;
    this->m_sizeTFANAllocatedSize = sizeTFAN;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->m_sizeTFANAllocatedSize;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    plVar4 = (long *)operator_new__(uVar3);
    this->m_sizeTFAN = plVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = this->m_verticesAllocatedSize;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    plVar4 = (long *)operator_new__(uVar3);
    this->m_vertices = plVar4;
    return;
  }
  __assert_fail("verticesSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                ,0xaf,"o3dgc::TriangleFans::TriangleFans(long, long)");
}

Assistant:

TriangleFans(long sizeTFAN     = O3DGC_TFANS_MIN_SIZE_TFAN_SIZE_BUFFER, 
                                                 long verticesSize = O3DGC_TFANS_MIN_SIZE_ALLOCATED_VERTICES_BUFFER)
                                    {
                                        assert(sizeTFAN     > 0);
                                        assert(verticesSize > 0);
                                        m_numTFANs              = 0;
                                        m_numVertices           = 0;
                                        m_verticesAllocatedSize = verticesSize;
                                        m_sizeTFANAllocatedSize = sizeTFAN;
                                        m_sizeTFAN              = new long [m_sizeTFANAllocatedSize];
                                        m_vertices              = new long [m_verticesAllocatedSize];
                                    }